

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::doAddRow(SPxLPBase<double> *this,LPRowBase<double> *row,bool scale)

{
  int iVar1;
  int iVar2;
  SPxScaler<double> *pSVar3;
  Nonzero<double> *pNVar4;
  double *pdVar5;
  ulong uVar6;
  undefined7 in_register_00000011;
  Item *pIVar7;
  int iVar8;
  double dVar9;
  int local_94;
  int idx;
  Item *local_78;
  double val;
  LPColBase<double> empty;
  
  iVar1 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  idx = iVar1;
  LPRowSetBase<double>::add(&this->super_LPRowSetBase<double>,row);
  pIVar7 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
           (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[iVar1].idx;
  local_94 = 0;
  if (((int)CONCAT71(in_register_00000011,scale) != 0) &&
     (pSVar3 = this->lp_scaler, pSVar3 != (SPxScaler<double> *)0x0)) {
    local_94 = (*pSVar3->_vptr_SPxScaler[1])
                         (pSVar3,pIVar7,&(this->super_LPColSetBase<double>).scaleExp);
    dVar9 = (this->super_LPRowSetBase<double>).right.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar1];
    pdVar5 = (double *)infinity();
    if (dVar9 < *pdVar5) {
      dVar9 = ldexp((this->super_LPRowSetBase<double>).right.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar1],local_94);
      (this->super_LPRowSetBase<double>).right.val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [iVar1] = dVar9;
    }
    dVar9 = (this->super_LPRowSetBase<double>).left.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar1];
    pdVar5 = (double *)infinity();
    if (-*pdVar5 < dVar9) {
      dVar9 = ldexp((this->super_LPRowSetBase<double>).left.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar1],local_94);
      (this->super_LPRowSetBase<double>).left.val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [iVar1] = dVar9;
    }
    dVar9 = ldexp((this->super_LPRowSetBase<double>).object.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar1],local_94);
    (this->super_LPRowSetBase<double>).object.val.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [iVar1] = dVar9;
    (this->super_LPRowSetBase<double>).scaleExp.data[iVar1] = local_94;
  }
  uVar6 = (ulong)(uint)(pIVar7->data).super_SVectorBase<double>.memused;
  local_78 = pIVar7;
  while (pIVar7 = local_78, 0 < (int)uVar6) {
    uVar6 = uVar6 - 1;
    pNVar4 = (local_78->data).super_SVectorBase<double>.m_elem;
    iVar1 = pNVar4[uVar6].idx;
    dVar9 = pNVar4[uVar6].val;
    if (scale) {
      dVar9 = ldexp(dVar9,(this->super_LPColSetBase<double>).scaleExp.data[iVar1] + local_94);
      (pIVar7->data).super_SVectorBase<double>.m_elem[uVar6].val = dVar9;
    }
    val = dVar9;
    if ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum <= iVar1) {
      LPColBase<double>::LPColBase(&empty,0);
      for (iVar8 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
          iVar8 <= iVar1; iVar8 = iVar8 + 1) {
        LPColSetBase<double>::add(&this->super_LPColSetBase<double>,&empty);
      }
      DSVectorBase<double>::~DSVectorBase(&empty.vec);
    }
    LPColSetBase<double>::add2(&this->super_LPColSetBase<double>,iVar1,1,&idx,&val);
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])(this,1);
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])
            (this,(ulong)(uint)((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                                thenum - iVar2));
  return;
}

Assistant:

void doAddRow(const LPRowBase<R>& row, bool scale = false)
   {
      int idx = nRows();
      int oldColNumber = nCols();
      int newRowScaleExp = 0;

      LPRowSetBase<R>::add(row);

      SVectorBase<R>& vec = rowVector_w(idx);

      DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

      // compute new row scaling factor and apply it to the sides
      if(scale && lp_scaler)
      {
         newRowScaleExp = lp_scaler->computeScaleExp(vec, colscaleExp);

         if(rhs(idx) < R(infinity))
            rhs_w(idx) = spxLdexp(rhs_w(idx), newRowScaleExp);

         if(lhs(idx) > R(-infinity))
            lhs_w(idx) = spxLdexp(lhs_w(idx), newRowScaleExp);

         maxRowObj_w(idx) = spxLdexp(maxRowObj_w(idx), newRowScaleExp);

         LPRowSetBase<R>::scaleExp[idx] = newRowScaleExp;
      }

      // now insert nonzeros to column file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new row and existing column scaling factors to new values in RowSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[i]);

         R val = vec.value(j);

         // create new columns if required
         if(i >= nCols())
         {
            LPColBase<R> empty;

            for(int k = nCols(); k <= i; ++k)
               LPColSetBase<R>::add(empty);
         }

         assert(i < nCols());
         LPColSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedRows(1);
      addedCols(nCols() - oldColNumber);
   }